

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::Load
               (istream *in,vector<unsigned_int,_std::allocator<unsigned_int>_> *object)

{
  uint local_2c;
  ulong uStack_28;
  uint obj;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  uint32_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *object_local;
  istream *in_local;
  
  pvStack_18 = object;
  object_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in;
  std::istream::read((char *)in,(long)&i + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvStack_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvStack_18,(ulong)i._4_4_);
  for (uStack_28 = 0; uStack_28 < i._4_4_; uStack_28 = uStack_28 + 1) {
    Load<unsigned_int>((istream *)object_local,&local_2c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvStack_18,&local_2c);
  }
  return;
}

Assistant:

static inline void Load(std::istream& in, TVec& object) {
        uint32_t size;
        in.read((char*)(&size), sizeof(size));
        object.clear();
        object.reserve(size);
        for (size_t i = 0; i < size; ++i) {
            TObj obj;
            NHandyPack::Load(in, obj);
            object.push_back(std::move(obj));
        }
    }